

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sdtFunc.h
# Opt level: O0

void __thiscall SDT::Noelse::~Noelse(Noelse *this)

{
  Noelse *this_local;
  
  ~Noelse(this);
  operator_delete(this,0x48);
  return;
}

Assistant:

virtual void dfs(TreeNode &treeNode,SDTNode *fa) {
            if (treeNode.sons.empty()) return;
            if(treeNode.opt==0){
                commonCal(treeNode,fa,this,code);
            }else if(treeNode.opt==1){
                Loc *loc1 = new Loc;
                Bool *bool1 = new Bool;
                sons.push_back(loc1);
                sons.push_back(bool1);
                isl=true;
                loc1->dfs(SON(0));
                inAss=true;
                inEval=true;
                bool1->dfs(SON(2));
                inAss=false;
                gen("=",bool1->addr,"_",loc1->addr);
            }else if(treeNode.opt==2){
                Bool *bool_1 = new Bool;
                Noelse *noelse_1 = new Noelse;
                sons.push_back(bool_1);
                sons.push_back(noelse_1);
                inEval = false;
                bool_1->gotoTrue = newLabel();
                bool_1->dfs(SON(2));
                writeLabel(bool_1->gotoTrue);
                for(auto t:(*bool_1->list)){
                    writeLabel(t);
                }
                delete bool_1->list;
                noelse_1->gotoNext = gotoNext;
                noelse_1->gotoBegin = newLabel();
                noelse_1->dfs(SON(4));
                gen("j","_","_",to_string(noelse_1->gotoBegin));
                writeLabel(bool_1->orLast);
            }else if(treeNode.opt==3){
                Bool *bool_1 = new Bool;
                Noelse *noelse_1 = new Noelse;
                sons.push_back(bool_1);
                sons.push_back(noelse_1);
                gotoBegin = newLabel();
                writeLabel(gotoBegin);
                inEval=false;
                bool_1->gotoTrue = newLabel();
                bool_1->dfs(SON(2));
                writeLabel(bool_1->gotoTrue);
                for(auto t:(*bool_1->list)){
                    writeLabel(t);
                }
                noelse_1->gotoNext = newLabel();
                noelse_1->dfs(SON(4));
                gen("j","_","_",to_string(gotoBegin));
                writeLabel(noelse_1->gotoNext);
                writeLabel(bool_1->orLast);
            }else if(treeNode.opt==4){
                Stmt *stmt_1 = new Stmt;
                Bool *bool_1 = new Bool;
                sons.push_back(stmt_1);
                sons.push_back(bool_1);
                gotoBegin = newLabel();
                writeLabel(gotoBegin);
                bool_1->gotoTrue = newLabel();
                writeLabel(bool_1->gotoTrue);
                stmt_1->dfs(SON(1));
                stmt_1->gotoNext = newLabel();
                inEval=false;
                bool_1->dfs(SON(4));
                for(auto t:(*bool_1->list)){
                    tempLabel[-t] = tempLabel[-gotoBegin];
                }
                writeLabel(stmt_1->gotoNext);
                writeLabel(bool_1->orLast);
            }else if(treeNode.opt==5){
                gen("j","_","_",to_string(gotoNext));
            }else if(treeNode.opt==6){
                Decls *decls = new Decls;
                Stmts *stmts = new Stmts;
                sons.push_back(decls);
                sons.push_back(stmts);
                stmts->gotoNext = gotoNext;
                decls->dfs(SON(1));
                stmts->dfs(SON(2));
            }
        }